

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_vprtybq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_ptr pTVar1;
  TCGv_ptr pTVar2;
  uintptr_t o_1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  if (ctx->altivec_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar1 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
    pTVar2 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
    local_28 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_vprtybq_ppc64,(TCGTemp *)0x0,2,&local_28);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vsplt(DisasContext *ctx, int vece)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int uimm, dofs, bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    uimm = UIMM5(ctx->opcode);
    bofs = avr_full_offset(rB(ctx->opcode));
    dofs = avr_full_offset(rD(ctx->opcode));

    /* Experimental testing shows that hardware masks the immediate.  */
    bofs += (uimm << vece) & 15;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 15;
    bofs &= ~((1 << vece) - 1);
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, vece, dofs, bofs, 16, 16);
}